

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  FieldDescriptor *this_00;
  byte bVar1;
  uint *puVar2;
  Descriptor *pDVar3;
  bool bVar4;
  CppStringType CVar5;
  DescriptorPool *pDVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  OneofDescriptor *pOVar10;
  Nonnull<const_char_*> pcVar11;
  DynamicMessage *this_01;
  Reflection *this_02;
  uint uVar12;
  DescriptorPool *pDVar13;
  long lVar14;
  long lVar15;
  undefined *puVar16;
  long *plVar17;
  FieldDescriptor *pFVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  TypeInfo *pTVar24;
  string_view str;
  ReflectionSchema schema;
  Descriptor *local_90;
  TypeInfo *local_88;
  DynamicMessageFactory *local_80;
  undefined1 local_78 [56];
  __atomic_base<long> local_40;
  int local_38;
  
  local_90 = type;
  if (((this->delegate_to_generated_factory_ != true) ||
      (pDVar13 = type->file_->pool_, pDVar6 = DescriptorPool::generated_pool(), pDVar13 != pDVar6))
     || (this_01 = (DynamicMessage *)MessageFactory::TryGetGeneratedPrototype(local_90),
        this_01 == (DynamicMessage *)0x0)) {
    absl::lts_20250127::container_internal::
    raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::Descriptor_const*,google::protobuf::DynamicMessageFactory::TypeInfo_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::Descriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DynamicMessageFactory::TypeInfo_const*>>>
    ::try_emplace_impl<google::protobuf::Descriptor_const*const&>
              ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>::iterator,_bool>
                *)local_78,&this->prototypes_,&local_90);
    if (*(long *)(local_78._8_8_ + 8) == 0) {
      local_88 = (TypeInfo *)operator_new(0xa0);
      (local_88->offsets)._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
      (local_88->has_bits_indices)._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint *)0x0;
      (local_88->class_data).super_ClassData.prototype = (MessageLite *)0x0;
      (local_88->class_data).super_ClassData.tc_table = (TcParseTableBase *)0x0;
      (local_88->class_data).super_ClassData.on_demand_register_arena_dtor =
           (_func_void_MessageLite_ptr_Arena_ptr *)0x0;
      (local_88->class_data).super_ClassData.is_initialized = Message::IsInitializedImpl;
      (local_88->class_data).super_ClassData.merge_to_from = Message::MergeImpl;
      (local_88->class_data).super_ClassData.message_creator.allocation_size_ = 0;
      (local_88->class_data).super_ClassData.message_creator.tag_ = kZeroInit;
      (local_88->class_data).super_ClassData.message_creator.alignment_ = '\0';
      (local_88->class_data).super_ClassData.message_creator.field_3.func_ = (Func)0x0;
      (local_88->class_data).super_ClassData.cached_size_offset = 0x18;
      (local_88->class_data).super_ClassData.is_lite = false;
      (local_88->class_data).super_ClassData.is_dynamic = false;
      (local_88->class_data).descriptor_methods = (DescriptorMethods *)Message::kDescriptorMethods;
      (local_88->class_data).descriptor_table = (DescriptorTable *)0x0;
      (local_88->class_data).reflection = (Reflection *)0x0;
      (local_88->class_data).descriptor = (Descriptor *)0x0;
      (local_88->class_data).get_metadata_tracker = (_func_void *)0x0;
      *(TypeInfo **)(local_78._8_8_ + 8) = local_88;
      (local_88->class_data).descriptor = local_90;
      (local_88->class_data).super_ClassData.is_dynamic = true;
      pDVar13 = this->pool_;
      if (pDVar13 == (DescriptorPool *)0x0) {
        pDVar13 = local_90->file_->pool_;
      }
      local_88->pool = pDVar13;
      local_88->factory = this;
      iVar23 = local_90->real_oneof_decl_count_;
      lVar7 = (long)local_90->field_count_ + (long)iVar23;
      uVar20 = 0xffffffffffffffff;
      if (-1 < (int)lVar7) {
        uVar20 = lVar7 * 4;
      }
      puVar8 = (uint *)operator_new__(uVar20);
      puVar9 = (local_88->offsets)._M_t.
               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
               super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      (local_88->offsets)._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
      super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar8;
      if (puVar9 != (uint *)0x0) {
        operator_delete__(puVar9);
      }
      pTVar24 = local_88;
      local_88->has_bits_offset = -1;
      local_80 = this;
      if (local_90->field_count_ < 1) {
        uVar21 = 0;
      }
      else {
        lVar7 = 0;
        uVar21 = 0;
        do {
          pFVar18 = local_90->fields_ + lVar7;
          bVar4 = internal::cpp::HasHasbit(pFVar18);
          if ((bVar4) &&
             (((bVar4 = FieldDescriptor::has_presence(pFVar18), pDVar3 = local_90, bVar4 ||
               (pFVar18->containing_type_ == (Descriptor *)0x0)) ||
              ((pFVar18->containing_type_->options_->field_0)._impl_.map_entry_ == false)))) {
            if (pTVar24->has_bits_offset == -1) {
              pTVar24->has_bits_offset = 0x20;
              uVar20 = (long)local_90->field_count_ * 4;
              if ((long)local_90->field_count_ < 0) {
                uVar20 = 0xffffffffffffffff;
              }
              puVar9 = (uint *)operator_new__(uVar20);
              if (0 < pDVar3->field_count_) {
                lVar14 = 0;
                do {
                  puVar9[lVar14] = 0xffffffff;
                  lVar14 = lVar14 + 1;
                } while (lVar14 < pDVar3->field_count_);
              }
              puVar2 = (pTVar24->has_bits_indices)._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                       super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
              (pTVar24->has_bits_indices)._M_t.
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = puVar9;
              if (puVar2 != (uint *)0x0) {
                operator_delete__(puVar2);
              }
            }
            (pTVar24->has_bits_indices)._M_t.
            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
            super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar7] = uVar21;
            uVar21 = uVar21 + 1;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < local_90->field_count_);
      }
      if ((int)uVar21 < 1) {
        uVar21 = 0x20;
      }
      else {
        iVar22 = uVar21 + 0x3e;
        if (-1 < (int)(uVar21 + 0x1f)) {
          iVar22 = uVar21 + 0x1f;
        }
        uVar12 = (iVar22 >> 5) * 4 + 0x27;
        uVar21 = (iVar22 >> 5) * 4 + 0x2e;
        if (-1 < (int)uVar12) {
          uVar21 = uVar12;
        }
        uVar21 = uVar21 & 0xfffffff8;
      }
      if (0 < iVar23) {
        pTVar24->oneof_case_offset = uVar21;
        uVar12 = uVar21 + iVar23 * 4 + 7;
        uVar21 = uVar21 + iVar23 * 4 + 0xe;
        if (-1 < (int)uVar12) {
          uVar21 = uVar12;
        }
        uVar21 = uVar21 & 0xfffffff8;
      }
      if (local_90->extension_range_count_ < 1) {
        pTVar24->extensions_offset = -1;
      }
      else {
        pTVar24->extensions_offset = uVar21;
        uVar12 = uVar21 + 0x26;
        if (-1 < (int)(uVar21 + 0x1f)) {
          uVar12 = uVar21 + 0x1f;
        }
        uVar21 = uVar12 & 0xfffffff8;
      }
      if (0 < local_90->field_count_) {
        lVar7 = 0;
        lVar14 = 0;
        do {
          pDVar3 = local_90;
          pFVar18 = local_90->fields_;
          if (((&pFVar18->field_0x3)[lVar7] & 1) == 0) {
LAB_0027ff7d:
            if (lVar14 < local_90->field_count_) {
              pcVar11 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (lVar14,(long)local_90->field_count_,"index < field_count()");
            }
            if (pcVar11 != (Nonnull<const_char_*>)0x0) goto LAB_002803cd;
            pFVar18 = pDVar3->fields_;
            bVar1 = (&pFVar18->field_0x1)[lVar7];
            bVar4 = (bool)((bVar1 & 0x20) >> 5);
            if (0xbf < bVar1 == bVar4) {
              pcVar11 = (Nonnull<const_char_*>)0x0;
            }
            else {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar4,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            }
            pTVar24 = local_88;
            if (pcVar11 != (Nonnull<const_char_*>)0x0) goto LAB_002803da;
            this_00 = (FieldDescriptor *)(&pFVar18->super_SymbolBase + lVar7);
            iVar23 = *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)(&pFVar18->type_)[lVar7] * 4);
            if (((&pFVar18->field_0x1)[lVar7] & 0x20) == 0) {
              switch(iVar23) {
              case 1:
              case 3:
              case 6:
              case 8:
                uVar12 = 4;
                break;
              case 2:
              case 4:
              case 5:
              case 10:
                uVar12 = 8;
                break;
              case 7:
                uVar12 = 1;
                break;
              case 9:
                CVar5 = FieldDescriptor::cpp_string_type(this_00);
                uVar12 = CVar5 - kView;
                if (2 < uVar12) goto switchD_0027fff0_default;
                puVar16 = &DAT_00466fac;
LAB_002800af:
                uVar12 = *(uint *)(puVar16 + (ulong)uVar12 * 4);
                break;
              default:
switchD_0027fff0_default:
                absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                          ((LogMessageDebugFatal *)local_78,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
                           ,0x102);
                str._M_str = "Can\'t get here.";
                str._M_len = 0xf;
                absl::lts_20250127::log_internal::LogMessage::
                CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                          ((LogMessage *)local_78,str);
                absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                          ((LogMessageDebugFatal *)local_78);
                uVar12 = 0;
              }
            }
            else {
              uVar12 = 0x10;
              if (7 < iVar23 - 1U) {
                if (iVar23 == 9) {
                  CVar5 = FieldDescriptor::cpp_string_type(this_00);
                  uVar12 = CVar5 - kView;
                  if (uVar12 < 3) {
                    puVar16 = &DAT_00466fa0;
                    goto LAB_002800af;
                  }
                }
                else if (iVar23 == 10) {
                  uVar12 = 0x18;
                  if ((&pFVar18->type_)[lVar7] == 0xb) {
                    bVar4 = FieldDescriptor::is_map_message_type(this_00);
                    uVar12 = 0x18;
                    if (bVar4) {
                      uVar12 = 0x30;
                    }
                  }
                  goto LAB_002800b9;
                }
                goto switchD_0027fff0_default;
              }
            }
LAB_002800b9:
            uVar19 = 8;
            if (uVar12 < 8) {
              uVar19 = uVar12;
            }
            iVar23 = uVar21 + uVar19 + -1;
            uVar21 = iVar23 - iVar23 % (int)uVar19;
            puVar8[lVar14] = uVar21;
            uVar21 = uVar21 + uVar12;
          }
          else {
            if (((&pFVar18->field_0x1)[lVar7] & 0x10) == 0) {
              lVar15 = 0;
            }
            else {
              lVar15 = *(long *)((long)&pFVar18->scope_ + lVar7);
              if (lVar15 == 0) {
                internal::protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb31);
              }
            }
            if (lVar15 == 0) goto LAB_002803e7;
            if ((*(int *)(lVar15 + 4) == 1) && ((*(byte *)(*(long *)(lVar15 + 0x30) + 1) & 2) != 0))
            {
              GetPrototypeNoLock((DynamicMessageFactory *)local_78);
LAB_002803c0:
              GetPrototypeNoLock();
LAB_002803cd:
              GetPrototypeNoLock();
LAB_002803da:
              GetPrototypeNoLock();
LAB_002803e7:
              internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb63);
            }
            if (((&pFVar18->field_0x3)[lVar7] & 1) == 0) goto LAB_0027ff7d;
          }
          lVar14 = lVar14 + 1;
          lVar7 = lVar7 + 0x58;
        } while (lVar14 < local_90->field_count_);
      }
      if (0 < local_90->real_oneof_decl_count_) {
        lVar7 = 0;
        do {
          uVar12 = uVar21 + 0xe;
          if (-1 < (int)(uVar21 + 7)) {
            uVar12 = uVar21 + 7;
          }
          puVar8[local_90->field_count_ + lVar7] = uVar12 & 0xfffffff8;
          uVar21 = (uVar12 & 0xfffffff8) + 8;
          lVar7 = lVar7 + 1;
        } while ((int)lVar7 < local_90->real_oneof_decl_count_);
      }
      pTVar24->weak_field_map_offset = -1;
      (pTVar24->class_data).super_ClassData.message_creator.allocation_size_ = uVar21;
      (pTVar24->class_data).super_ClassData.message_creator.tag_ = kFunc;
      (pTVar24->class_data).super_ClassData.message_creator.alignment_ = '\b';
      (pTVar24->class_data).super_ClassData.message_creator.field_3.func_ = DynamicMessage::NewImpl;
      if (0 < local_90->real_oneof_decl_count_) {
        iVar23 = 0;
        do {
          pOVar10 = Descriptor::real_oneof_decl(local_90,iVar23);
          if (0 < pOVar10->field_count_) {
            lVar14 = 0;
            lVar7 = 0;
            do {
              pOVar10 = Descriptor::real_oneof_decl(local_90,iVar23);
              if (lVar7 < pOVar10->field_count_) {
                pcVar11 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                    (lVar7,(long)pOVar10->field_count_,"index < field_count()");
              }
              if (pcVar11 != (Nonnull<const_char_*>)0x0) goto LAB_002803c0;
              pFVar18 = pOVar10->fields_;
              if (((&pFVar18->field_0x1)[lVar14] & 8) == 0) {
                plVar17 = (long *)(*(long *)((long)&pFVar18->containing_type_ + lVar14) + 0x40);
              }
              else {
                lVar15 = *(long *)((long)&pFVar18->scope_ + lVar14);
                if (lVar15 == 0) {
                  plVar17 = (long *)(*(long *)((long)&pFVar18->file_ + lVar14) + 0x78);
                }
                else {
                  plVar17 = (long *)(lVar15 + 0x68);
                }
              }
              puVar8[(int)((ulong)((long)pFVar18 + (lVar14 - *plVar17)) >> 3) * -0x45d1745d] =
                   0x40000000;
              lVar7 = lVar7 + 1;
              pOVar10 = Descriptor::real_oneof_decl(local_90,iVar23);
              lVar14 = lVar14 + 0x58;
            } while (lVar7 < pOVar10->field_count_);
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 < local_90->real_oneof_decl_count_);
      }
      this_01 = (DynamicMessage *)operator_new((long)(int)uVar21);
      memset(this_01,0,(long)(int)uVar21);
      pTVar24 = local_88;
      DynamicMessage::DynamicMessage(this_01,local_88,false);
      local_78._0_8_ = (pTVar24->class_data).super_ClassData.prototype;
      local_78._8_8_ =
           (pTVar24->offsets)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      local_78._16_8_ =
           (pTVar24->has_bits_indices)._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
      local_78._24_4_ = pTVar24->has_bits_offset;
      local_78._28_4_ = pTVar24->extensions_offset;
      local_78._32_4_ = pTVar24->oneof_case_offset;
      local_78._36_4_ = (pTVar24->class_data).super_ClassData.message_creator.allocation_size_;
      local_78._40_4_ = pTVar24->weak_field_map_offset;
      local_78._48_8_ = (MaybeInitializedPtr)0x0;
      local_40._M_i = -0x100000000;
      local_38 = -1;
      this_02 = (Reflection *)operator_new(0x70);
      Reflection::Reflection
                (this_02,(pTVar24->class_data).descriptor,(ReflectionSchema *)local_78,pTVar24->pool
                 ,&local_80->super_MessageFactory);
      (pTVar24->class_data).reflection = this_02;
      DynamicMessage::CrossLinkPrototypes(this_01);
    }
    else {
      this_01 = *(DynamicMessage **)(*(long *)(local_78._8_8_ + 8) + 0x38);
    }
  }
  return &this_01->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* PROTOBUF_NONNULL type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    const Message* result = MessageFactory::TryGetGeneratedPrototype(type);
    if (result != nullptr) return result;
    // Otherwise, we will create it dynamically so keep going.
  }

  const TypeInfo** target = &prototypes_[type];
  if (*target != nullptr) {
    // Already exists.
    return static_cast<const Message*>((*target)->class_data.prototype);
  }

  TypeInfo* type_info = new TypeInfo;
  *target = type_info;

  type_info->class_data.descriptor = type;
  type_info->class_data.is_dynamic = true;
  type_info->pool = (pool_ == nullptr) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to Reflection's constructor.
  // This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.
  int real_oneof_count = type->real_oneof_decl_count();

  // Compute size and offsets.
  uint32_t* offsets = new uint32_t[type->field_count() + real_oneof_count];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = -1;
  int max_hasbit = 0;
  for (int i = 0; i < type->field_count(); i++) {
    const FieldDescriptor* field = type->field(i);

    // If a field has hasbits, it could be either an explicit-presence or
    // implicit-presence field. Explicit presence fields will have "true
    // hasbits" where hasbit is set iff field is present. Implicit presence
    // fields will have "hint hasbits" where
    // - if hasbit is unset, field is not present.
    // - if hasbit is set, field is present if it is also nonempty.
    if (internal::cpp::HasHasbit(field)) {
      // TODO: b/112602698 - during Python textproto serialization, MapEntry
      // messages may be generated from DynamicMessage on the fly. C++
      // implementations of MapEntry messages always have hasbits, but
      // has_presence return values might be different depending on how field
      // presence is set. For MapEntrys, has_presence returns true for
      // explicit-presence (proto2) messages and returns false for
      // implicit-presence (proto3) messages.
      //
      // In the case of implicit presence, there is a potential inconsistency in
      // code behavior between C++ and Python:
      // - If C++ implementation is linked, hasbits are always generated for
      //   MapEntry messages, and MapEntry messages will behave like explicit
      //   presence.
      // - If C++ implementation is not linked, Python defaults to the
      //   DynamicMessage implementation for MapEntrys which traditionally does
      //   not assume the presence of hasbits, so the default Python behavior
      //   for MapEntry messages (by default C++ implementations are not linked)
      //   will fall back to the DynamicMessage implementation and behave like
      //   implicit presence.
      // This is an inconsistency and this if-condition preserves it.
      //
      // Longer term, we want to get rid of this additional if-check of
      // IsMapEntryField. It might take one or more breaking changes and more
      // consensus gathering & clarification though.
      if (!field->has_presence() && IsMapEntryField(field)) {
        continue;
      }

      if (type_info->has_bits_offset == -1) {
        // At least one field in the message requires a hasbit, so allocate
        // hasbits.
        type_info->has_bits_offset = size;
        uint32_t* has_bits_indices = new uint32_t[type->field_count()];
        for (int j = 0; j < type->field_count(); j++) {
          // Initialize to -1, fields that need a hasbit will overwrite.
          has_bits_indices[j] = static_cast<uint32_t>(-1);
        }
        type_info->has_bits_indices.reset(has_bits_indices);
      }
      type_info->has_bits_indices[i] = max_hasbit++;
    }
  }

  if (max_hasbit > 0) {
    int has_bits_array_size = DivideRoundingUp(max_hasbit, bitsizeof(uint32_t));
    size += has_bits_array_size * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The oneof_case, if any. It is an array of uint32s.
  if (real_oneof_count > 0) {
    type_info->oneof_case_offset = size;
    size += real_oneof_count * sizeof(uint32_t);
    size = AlignOffset(size);
  }

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  //
  // TODO:  Optimize the order of fields to minimize padding.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    // Oneof fields do not use any space.
    if (!InRealOneof(type->field(i))) {
      int field_size = FieldSpaceUsed(type->field(i));
      size = AlignTo(size, std::min(kSafeAlignment, field_size));
      offsets[i] = size;
      size += field_size;
    }
  }

  // The oneofs.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    size = AlignTo(size, kSafeAlignment);
    offsets[type->field_count() + i] = size;
    size += kMaxOneofUnionSize;
  }

  type_info->weak_field_map_offset = -1;

  type_info->class_data.message_creator =
      internal::MessageCreator(DynamicMessage::NewImpl, size, kSafeAlignment);

  // Construct the reflection object.

  // Compute the size of default oneof instance and offsets of default
  // oneof fields.
  for (int i = 0; i < type->real_oneof_decl_count(); i++) {
    for (int j = 0; j < type->real_oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = type->real_oneof_decl(i)->field(j);
      // oneof fields are not accessed through offsets, but we still have the
      // entry for each.
      // Mark the field to prevent unintentional access through reflection.
      // Don't use the top bit because that is for unused fields.
      offsets[field->index()] = internal::kInvalidFieldOffsetTag;
    }
  }

  // Allocate the prototype fields.
  void* base = operator new(size);
  memset(base, 0, size);

  // We have already locked the factory so we should not lock in the constructor
  // of dynamic message to avoid dead lock.
  DynamicMessage* prototype = new (base) DynamicMessage(type_info, false);

  internal::ReflectionSchema schema = {
      static_cast<const Message*>(type_info->class_data.prototype),
      type_info->offsets.get(),
      type_info->has_bits_indices.get(),
      type_info->has_bits_offset,
      type_info->extensions_offset,
      type_info->oneof_case_offset,
      static_cast<int>(type_info->class_data.allocation_size()),
      type_info->weak_field_map_offset,
      nullptr,  // inlined_string_indices_
      0,        // inlined_string_donated_offset_
      -1,       // split_offset_
      -1,       // sizeof_split_
  };

  type_info->class_data.reflection = new Reflection(
      type_info->class_data.descriptor, schema, type_info->pool, this);

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}